

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O0

bool __thiscall
mp::
Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ContinueStdSOC(Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *this,double cX,int vX,double cY,ConeArgs *rhs_args)

{
  value_type vVar1;
  ulong uVar2;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar3;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  size_t sVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  reference piVar10;
  MCType *this_00;
  long in_RDX;
  value_type in_ESI;
  MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  value_type in_XMM0_Qa;
  double dVar11;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  NodeRange NVar12;
  int r;
  const_iterator __end0;
  const_iterator __begin0;
  vector<int,_std::allocator<int>_> *__range2;
  size_t iPush;
  double coefY_abs;
  vector<double,_std::allocator<double>_> c;
  vector<int,_std::allocator<int>_> x;
  size_t constNZ;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffe00;
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
  *this_01;
  allocator_type *in_stack_fffffffffffffe10;
  size_type in_stack_fffffffffffffe18;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe20;
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
  *in_stack_fffffffffffffe28;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  NodeIndexRange in_stack_fffffffffffffe48;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffe50;
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
  local_128;
  int local_bc;
  int *local_b8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_b0;
  long local_a8;
  NodeRange local_a0;
  ulong local_90;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *local_88;
  vector<double,_std::allocator<double>_> local_78 [2];
  vector<int,_std::allocator<int>_> local_48;
  ulong local_30;
  long local_28;
  double local_20;
  value_type local_14;
  value_type local_10;
  
  local_20 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_30 = (ulong)(-(uint)(ABS(*(double *)(in_RDX + 0x38)) != 0.0) & 1);
  local_28 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_XMM0_Qa;
  ConeArgs::size((ConeArgs *)0x66a18d);
  std::allocator<int>::allocator((allocator<int> *)0x66a1b7);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,(allocator_type *)in_stack_fffffffffffffe10);
  std::allocator<int>::~allocator((allocator<int> *)0x66a1e3);
  ConeArgs::size((ConeArgs *)0x66a1f0);
  std::allocator<double>::allocator((allocator<double> *)0x66a21a);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  std::allocator<double>::~allocator((allocator<double> *)0x66a246);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,0);
  *pvVar5 = local_14;
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_78,0);
  *pvVar6 = ABS(local_10);
  local_88 = (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)((ulong)local_20 & 0x7fffffffffffffff);
  local_90 = 0;
  while( true ) {
    uVar2 = local_90;
    sVar7 = ConeArgs::size((ConeArgs *)0x66a2ec);
    NVar12.ir_ = in_stack_fffffffffffffe48;
    NVar12.pvn_ = (ValueNode *)in_stack_fffffffffffffe50;
    if (sVar7 <= uVar2) break;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_28 + 0x20),local_90);
    vVar1 = *pvVar8;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,local_90 + 1);
    pFVar3 = local_88;
    *pvVar5 = vVar1;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_28 + 8),local_90);
    dVar11 = *pvVar9;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_78,local_90 + 1);
    *pvVar6 = (double)pFVar3 * dVar11;
    local_90 = local_90 + 1;
  }
  if (local_30 != 0) {
    MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::MC(in_RDI);
    NVar12 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::MakeFixedVar(in_stack_fffffffffffffe50,(double)in_stack_fffffffffffffe48);
    local_a0 = NVar12;
    in_stack_fffffffffffffe44 = pre::NodeRange::operator_cast_to_int((NodeRange *)0x66a45a);
    pvVar5 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00);
    *pvVar5 = in_stack_fffffffffffffe44;
    in_stack_fffffffffffffe30 = local_88;
    dVar11 = sqrt(*(double *)(local_28 + 0x38));
    dVar11 = (double)in_stack_fffffffffffffe30 * dVar11;
    pvVar6 = std::vector<double,_std::allocator<double>_>::back
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00);
    *pvVar6 = dVar11;
  }
  local_a8 = local_28 + 0x48;
  local_b0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  local_b8 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffe00,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    if (!bVar4) break;
    piVar10 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&local_b0);
    local_bc = *piVar10;
    MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::MC(in_RDI);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::DecrementVarUsage(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_b0);
  }
  this_00 = MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            ::MC(in_RDI);
  this_01 = &local_128;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)this_01,
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_01,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
  ::CustomStaticConstraint
            ((CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
              *)NVar12.pvn_,(Arguments *)NVar12.ir_,
             (Parameters *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  AddConstraint<mp::CustomStaticConstraint<std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,mp::QuadraticConeId>>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
  ::~CustomStaticConstraint(this_01);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  return true;
}

Assistant:

bool ContinueStdSOC(
      double cX, int vX, double cY,
      const ConeArgs& rhs_args) {
    const size_t constNZ = (0.0 != std::fabs(rhs_args.const_term));
    std::vector<int> x(rhs_args.size()+1+constNZ);
    std::vector<double> c(rhs_args.size()+1+constNZ);
    x[0] = vX;
    c[0] = std::fabs(cX);
    auto coefY_abs = std::fabs(cY);
    for (size_t iPush=0; iPush<rhs_args.size(); ++iPush) {
      x[iPush+1] = rhs_args.vars_[iPush];
      c[iPush+1] = coefY_abs * rhs_args.coefs_[iPush];
    }
    if (constNZ) {
      assert(0.0 < rhs_args.const_term);
      x.back() = int( MC().MakeFixedVar(1.0) );
      c.back() = coefY_abs * std::sqrt(rhs_args.const_term);
    }
    for (auto r: rhs_args.res_vars_to_delete_)
      MC().DecrementVarUsage(r);
    MC().AddConstraint(
          QuadraticConeConstraint(
            std::move(x), std::move(c)));
    return true;
  }